

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

intrusive_list<wabt::ModuleField> * __thiscall
wabt::intrusive_list<wabt::ModuleField>::operator=
          (intrusive_list<wabt::ModuleField> *this,intrusive_list<wabt::ModuleField> *other)

{
  ModuleField *pMVar1;
  
  clear(this);
  pMVar1 = other->last_;
  this->first_ = other->first_;
  this->last_ = pMVar1;
  this->size_ = other->size_;
  other->first_ = (ModuleField *)0x0;
  other->last_ = (ModuleField *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline intrusive_list<T>& intrusive_list<T>::operator=(
    intrusive_list<T>&& other) {
  clear();
  first_ = other.first_;
  last_ = other.last_;
  size_ = other.size_;
  other.first_ = other.last_ = nullptr;
  other.size_ = 0;
  return *this;
}